

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O3

void __thiscall
ASDCP::KLVPacket::Dump(KLVPacket *this,FILE *stream,Dictionary *Dict,bool show_value)

{
  byte_t *pbVar1;
  ulong uVar2;
  char *pcVar3;
  MDDEntry *pMVar4;
  ulong uVar5;
  char buf [64];
  char acStack_88 [72];
  UL local_40;
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  pbVar1 = this->m_KeyStart;
  if (pbVar1 == (byte_t *)0x0) {
    if ((this->m_UL).super_Identifier<16U>.m_HasValue != true) {
      fwrite("*** Malformed KLV packet ***\n",0x1d,1,(FILE *)stream);
      return;
    }
    pcVar3 = UL::EncodeString(&this->m_UL,acStack_88,0x40);
    fprintf((FILE *)stream,"%s\n",pcVar3);
  }
  else {
    local_40.super_Identifier<16U>.m_HasValue = true;
    local_40.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pbVar1;
    local_40.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pbVar1 + 8);
    local_40.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_0021d318;
    pcVar3 = UL::EncodeString(&local_40,acStack_88,0x40);
    fputs(pcVar3,(FILE *)stream);
    pMVar4 = Dictionary::FindULAnyVersion(Dict,this->m_KeyStart);
    if (pMVar4 == (MDDEntry *)0x0) {
      pcVar3 = "Unknown";
    }
    else {
      pcVar3 = pMVar4->name;
    }
    fprintf((FILE *)stream,"  len: %7llu (%s)\n",this->m_ValueLength,pcVar3);
    if ((show_value && this->m_ValueStart != (uchar *)0x0) &&
       (uVar2 = this->m_ValueLength, uVar2 < 1000)) {
      uVar5 = 0x80;
      if (uVar2 < 0x80) {
        uVar5 = uVar2;
      }
      Kumu::hexdump(this->m_ValueStart,(uint)uVar5,(_IO_FILE *)stream);
    }
  }
  return;
}

Assistant:

void
ASDCP::KLVPacket::Dump(FILE* stream, const Dictionary& Dict, bool show_value)
{
  char buf[64];

  if ( stream == 0 )
    stream = stderr;

  if ( m_KeyStart != 0 )
    {
      UL TmpUL(m_KeyStart);
      fprintf(stream, "%s", TmpUL.EncodeString(buf, 64));

      const MDDEntry* Entry = Dict.FindULAnyVersion(m_KeyStart);
      fprintf(stream, "  len: %7llu (%s)\n", m_ValueLength, (Entry ? Entry->name : "Unknown"));

      if ( m_ValueStart && show_value && m_ValueLength < 1000 )
	Kumu::hexdump(m_ValueStart, Kumu::xmin(m_ValueLength, (ui64_t)128), stream);
    }
  else if ( m_UL.HasValue() )
    {
      fprintf(stream, "%s\n", m_UL.EncodeString(buf, 64));
    }
  else
    {
      fprintf(stream, "*** Malformed KLV packet ***\n");
    }
}